

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

_Bool zt_cstr_abspath(char *path)

{
  _Bool _Var1;
  
  _Var1 = true;
  if ((*path != '/') && ((*path != '.' || (path[1] != '/')))) {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
zt_cstr_abspath(const char * path) {

    int len = strlen(PATH_SEPERATOR);

    if ((strncmp(path, PATH_SEPERATOR, len) == 0) ||
        (path[0] == '.' && strncmp(&path[1], PATH_SEPERATOR, len) == 0)) {
        return true;
    }

    return false;
}